

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNMachine<char>::filter_nodes
          (ATNMachine<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  pointer *this_00;
  const_reference cVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> *pvVar7;
  reference pvVar8;
  reference this_01;
  reference this_02;
  ATNTransition<char> *t_1;
  iterator __end0_2;
  iterator __begin0_2;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> *__range3
  ;
  ATNNode<char> *n;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *__range2;
  reference local_a0;
  ATNTransition<char> *t;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> *__range4
  ;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> filtered;
  int local_60;
  int dest_index;
  int src_index;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> nodes;
  vector<bool,_std::allocator<bool>_> *mask_local;
  ATNMachine<char> *this_local;
  
  std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::vector
            ((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
             &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                    (&this->m_nodes);
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,sVar4,&local_49);
  std::allocator<int>::~allocator(&local_49);
  sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                    (&this->m_nodes);
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(mask);
  if (sVar4 != sVar5) {
    __assert_fail("m_nodes.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                  ,0x148,
                  "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                 );
  }
  filtered.
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (local_60 = 0;
      sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
              size(&this->m_nodes), (ulong)(long)local_60 < sVar4; local_60 = local_60 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)local_60);
    if (cVar1) {
      std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ::vector((vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                *)&__range4);
      pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::at
                         (&this->m_nodes,(long)local_60);
      pvVar7 = ATNNode<char>::get_transitions(pvVar6);
      __end0 = std::
               vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ::begin(pvVar7);
      t = (ATNTransition<char> *)
          std::
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
          end(pvVar7);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
                                         *)&t), bVar2) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
                   ::operator*(&__end0);
        iVar3 = ATNTransition<char>::dest(local_a0);
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)iVar3);
        if (cVar1) {
          std::
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
          push_back((vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                     *)&__range4,local_a0);
        }
        __gnu_cxx::
        __normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
        ::operator++(&__end0);
      }
      pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::at
                         (&this->m_nodes,(long)local_60);
      ATNNode<char>::ATNNode
                ((ATNNode<char> *)&__range2,pvVar6,
                 (vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                  *)&__range4);
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::push_back
                ((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                 &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)&__range2);
      ATNNode<char>::~ATNNode((ATNNode<char> *)&__range2);
      iVar3 = filtered.
              super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_60);
      *pvVar8 = iVar3;
      filtered.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           filtered.
           super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ::~vector((vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                 *)&__range4);
    }
    else {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_60);
      *pvVar8 = -1;
    }
  }
  this_00 = &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  __end0_1 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
             begin((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                   this_00);
  n = (ATNNode<char> *)
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::end
                ((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                 this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
                        *)&n);
    if (!bVar2) {
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::operator=
                (&this->m_nodes,
                 (vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                 &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::~vector
                ((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                 &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
              ::operator*(&__end0_1);
    pvVar7 = ATNNode<char>::get_transitions(this_01);
    __end0_2 = std::
               vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ::begin(pvVar7);
    t_1 = (ATNTransition<char> *)
          std::
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
          end(pvVar7);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_2,
                              (__normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
                               *)&t_1), bVar2) {
      this_02 = __gnu_cxx::
                __normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
                ::operator*(&__end0_2);
      iVar3 = ATNTransition<char>::dest(this_02);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar3);
      if (*pvVar8 < 0) {
        __assert_fail("index_map[t.dest()] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                      ,0x164,
                      "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                     );
      }
      iVar3 = ATNTransition<char>::dest(this_02);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar3);
      ATNTransition<char>::dest(this_02,*pvVar8);
      __gnu_cxx::
      __normal_iterator<Centaurus::ATNTransition<char>_*,_std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>_>
      ::operator++(&__end0_2);
    }
    __gnu_cxx::
    __normal_iterator<Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
    ::operator++(&__end0_1);
  } while( true );
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<ATNNode<TCHAR> > nodes;
        std::vector<int> index_map(m_nodes.size());

        assert(m_nodes.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_nodes.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<ATNTransition<TCHAR> > filtered;
                for (const auto& t : m_nodes.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.push_back(ATNNode<TCHAR>(m_nodes.at(src_index), std::move(filtered)));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                assert(index_map[t.dest()] >= 0);

                t.dest(index_map[t.dest()]);
            }
        }
        m_nodes = std::move(nodes);
    }